

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void __thiscall
bk_lib::pod_vector<Clasp::Asp::PrgEdge,std::allocator<Clasp::Asp::PrgEdge>>::
insert_impl<unsigned_int,bk_lib::detail::Memcpy<Clasp::Asp::PrgEdge>>
          (pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *this,iterator pos,
          uint n,Memcpy<Clasp::Asp::PrgEdge> *pred)

{
  size_type sVar1;
  uint uVar2;
  PrgEdge *__dest;
  iterator pPVar3;
  ulong uVar4;
  uint in_EDX;
  ebo *in_RSI;
  new_allocator<Clasp::Asp::PrgEdge> *in_RDI;
  const_pointer buf;
  size_type prefix;
  pointer temp;
  size_type new_cap;
  ebo *in_stack_ffffffffffffffa0;
  PrgEdge *in_stack_ffffffffffffffa8;
  ebo *out;
  undefined4 in_stack_ffffffffffffffb8;
  pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *in_stack_ffffffffffffffc0;
  
  sVar1 = pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::size
                    ((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)in_RDI
                    );
  uVar2 = sVar1 + in_EDX;
  sVar1 = pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::capacity
                    ((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)in_RDI
                    );
  if (sVar1 < uVar2) {
    sVar1 = pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::grow_size
                      ((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)
                       in_RDI,(size_type)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    __dest = __gnu_cxx::new_allocator<Clasp::Asp::PrgEdge>::allocate
                       (in_RDI,(size_type)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    out = in_RSI;
    pPVar3 = pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::begin
                       ((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)
                        in_RDI);
    uVar4 = (long)out - (long)pPVar3 >> 2;
    pPVar3 = pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::begin
                       ((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)
                        in_RDI);
    if (pPVar3 != (iterator)0x0) {
      memcpy(__dest,pPVar3,(uVar4 & 0xffffffff) << 2);
    }
    detail::Memcpy<Clasp::Asp::PrgEdge>::operator()
              ((Memcpy<Clasp::Asp::PrgEdge> *)in_RDI,(PrgEdge *)out,
               (size_t)in_stack_ffffffffffffffa0);
    if (in_RSI != (ebo *)0x0) {
      in_stack_ffffffffffffffa0 = in_RSI;
      pPVar3 = pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::end
                         ((pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_> *)
                          in_RDI);
      memcpy(__dest + (uVar4 & 0xffffffff) + (ulong)in_EDX,in_stack_ffffffffffffffa0,
             ((long)pPVar3 - (long)in_RSI >> 2) << 2);
    }
    pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::ebo::release
              (in_stack_ffffffffffffffa0);
    *(PrgEdge **)in_RDI = __dest;
    *(uint *)(in_RDI + 8) = in_EDX + *(int *)(in_RDI + 8);
    *(size_type *)(in_RDI + 0xc) = sVar1;
  }
  else {
    pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::move_right
              (in_stack_ffffffffffffffc0,(iterator)CONCAT44(uVar2,in_stack_ffffffffffffffb8),
               (size_type)((ulong)in_RDI >> 0x20));
    detail::Memcpy<Clasp::Asp::PrgEdge>::operator()
              ((Memcpy<Clasp::Asp::PrgEdge> *)in_RDI,in_stack_ffffffffffffffa8,
               (size_t)in_stack_ffffffffffffffa0);
    *(uint *)(in_RDI + 8) = in_EDX + *(size_type *)(in_RDI + 8);
  }
  return;
}

Assistant:

void insert_impl(iterator pos, ST n, const P& pred) {
		assert(n == 0 || (size()+n) > size() );
		if (size()+n <= capacity()) {
			move_right(pos, n);
			pred(pos, n);
			ebo_.size += n;
		}
		else {
			size_type new_cap = grow_size(n);
			pointer temp      = ebo_.allocate(new_cap);
			size_type prefix  = static_cast<size_type>(pos-begin());
			// copy prefix
			if (const_pointer buf = begin()) {
				std::memcpy(temp, buf, prefix*sizeof(T));
			}
			// insert new stuff
			pred(temp+prefix, n);
			// copy suffix
			if (pos) {
				std::memcpy(temp+prefix+n, pos, (end()-pos)*sizeof(T));
			}
			ebo_.release();
			ebo_.buf  = temp;
			ebo_.size+= n;
			ebo_.cap  = new_cap;
		}
	}